

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O2

void __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::checkMsgLength
          (ManyToOneRingBuffer *this,index_t length)

{
  IllegalArgumentException *this_00;
  char *pcVar1;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (length <= this->m_maxMsgLength) {
    return;
  }
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_98,this->m_maxMsgLength);
  std::operator+(&local_78,"encoded message exceeds maxMsgLength of ",&local_98);
  std::operator+(&local_58,&local_78," length=");
  std::__cxx11::to_string(&local_b8,length);
  std::operator+(&local_38,&local_58,&local_b8);
  std::__cxx11::string::string
            ((string *)&local_d8,
             "void aeron::concurrent::ringbuffer::ManyToOneRingBuffer::checkMsgLength(util::index_t) const"
             ,&local_f9);
  pcVar1 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/ringbuffer/ManyToOneRingBuffer.h"
                            );
  std::__cxx11::string::string((string *)&local_f8,pcVar1,&local_fa);
  util::IllegalArgumentException::IllegalArgumentException
            (this_00,&local_38,&local_d8,&local_f8,0x139);
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

inline void checkMsgLength(util::index_t length) const
    {
        if (length > m_maxMsgLength)
        {
            throw util::IllegalArgumentException(
                "encoded message exceeds maxMsgLength of " + std::to_string(m_maxMsgLength) +
                " length=" + std::to_string(length),
                SOURCEINFO);
        }
    }